

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [13];
  undefined1 auVar46 [13];
  ushort uVar47;
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  unkuint9 Var55;
  undefined1 auVar56 [11];
  undefined1 auVar57 [13];
  undefined1 auVar58 [14];
  unkbyte10 Var59;
  undefined1 auVar60 [15];
  undefined1 auVar61 [11];
  undefined1 auVar62 [13];
  undefined1 auVar63 [14];
  uint5 uVar64;
  unkbyte9 Var65;
  undefined1 auVar66 [15];
  undefined1 auVar67 [11];
  undefined1 auVar68 [13];
  undefined1 auVar69 [14];
  undefined1 auVar70 [15];
  undefined1 auVar71 [11];
  undefined1 auVar72 [13];
  undefined1 auVar73 [14];
  undefined1 auVar74 [15];
  undefined1 auVar75 [11];
  undefined1 auVar76 [13];
  undefined1 auVar77 [14];
  undefined1 auVar78 [11];
  undefined1 auVar79 [13];
  undefined1 auVar80 [14];
  undefined1 auVar81 [15];
  undefined1 auVar82 [11];
  undefined1 auVar83 [13];
  undefined1 auVar84 [14];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [13];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [13];
  uint6 uVar101;
  uint6 uVar102;
  uint6 uVar103;
  undefined1 auVar104 [16];
  uint uVar105;
  uint uVar106;
  uint uVar107;
  long lVar108;
  ulong uVar109;
  uchar *puVar110;
  ulong uVar111;
  byte bVar112;
  char cVar113;
  ulong uVar114;
  ulong uVar115;
  byte bVar116;
  uint uVar117;
  byte bVar118;
  byte bVar119;
  uchar *puVar120;
  long lVar121;
  long lVar122;
  uchar *puVar123;
  byte bVar124;
  uint uVar125;
  uchar *puVar126;
  uchar *puVar127;
  uchar *puVar128;
  uchar *puVar129;
  uint uVar130;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  ushort uVar141;
  ushort uVar142;
  int iVar145;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  uint uVar149;
  int iVar150;
  undefined1 auVar146 [16];
  uint uVar151;
  uint uVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar153;
  uint uVar162;
  uint uVar163;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  uint uVar165;
  int iVar169;
  int iVar171;
  undefined1 auVar166 [16];
  uint uVar170;
  uint uVar172;
  uint uVar173;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar174 [16];
  uint uVar177;
  ushort uVar178;
  uint uVar179;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  uint uVar180;
  int iVar182;
  int iVar183;
  undefined1 auVar181 [16];
  ushort uVar184;
  uint uVar185;
  uint uVar186;
  uchar *local_d0;
  uchar *local_c8;
  long local_90;
  ulong uVar131;
  
  auVar104 = _DAT_00158070;
  if (h == 0) {
    return 0;
  }
  uVar117 = bpp + 7;
  uVar130 = uVar117 >> 3;
  uVar131 = (ulong)uVar130;
  lVar121 = (ulong)bpp * (ulong)(w >> 3);
  uVar115 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar121 + uVar115;
  lVar122 = lVar121 + uVar115 + 1;
  puVar129 = in + 1;
  local_90 = (long)out - uVar131;
  lVar121 = uVar1 - uVar131;
  puVar123 = in + 3;
  puVar126 = in + 4;
  puVar110 = out + uVar131 + 3;
  puVar127 = in + uVar131 + 4;
  local_d0 = out + uVar131;
  local_c8 = in + uVar131 + 1;
  uVar115 = 0;
  puVar120 = (uchar *)0x0;
  puVar128 = out;
  do {
    switch(in[lVar122 * uVar115]) {
    case '\0':
      if (uVar1 != 0) {
        uVar109 = 0;
        do {
          puVar128[uVar109] = puVar129[uVar109];
          uVar109 = uVar109 + 1;
        } while (uVar1 != uVar109);
      }
      break;
    case '\x01':
      if (7 < uVar117) {
        uVar109 = 0;
        do {
          puVar128[uVar109] = puVar129[uVar109];
          uVar109 = uVar109 + 1;
        } while (uVar131 != uVar109);
      }
      if (uVar1 != uVar131) {
        lVar108 = 0;
        do {
          local_d0[lVar108] = puVar128[lVar108] + local_c8[lVar108];
          lVar108 = lVar108 + 1;
        } while (lVar121 != lVar108);
      }
      break;
    case '\x02':
      if (puVar120 == (uchar *)0x0) {
        if (uVar1 != 0) {
          uVar109 = 0;
          do {
            puVar128[uVar109] = puVar129[uVar109];
            uVar109 = uVar109 + 1;
          } while (uVar1 != uVar109);
        }
      }
      else if (uVar1 != 0) {
        uVar109 = 0;
        do {
          puVar128[uVar109] = puVar120[uVar109] + puVar129[uVar109];
          uVar109 = uVar109 + 1;
        } while (uVar1 != uVar109);
      }
      break;
    case '\x03':
      if (puVar120 == (uchar *)0x0) {
        if (7 < uVar117) {
          uVar109 = 0;
          do {
            puVar128[uVar109] = puVar129[uVar109];
            uVar109 = uVar109 + 1;
          } while (uVar131 != uVar109);
        }
        if (uVar1 != uVar131) {
          lVar108 = 0;
          do {
            local_d0[lVar108] = (puVar128[lVar108] >> 1) + local_c8[lVar108];
            lVar108 = lVar108 + 1;
          } while (lVar121 != lVar108);
        }
      }
      else {
        if (uVar117 < 8) {
          uVar111 = 0;
          uVar109 = 0;
        }
        else {
          uVar109 = 0;
          do {
            puVar128[uVar109] = (puVar120[uVar109] >> 1) + puVar129[uVar109];
            uVar109 = uVar109 + 1;
          } while (uVar131 != uVar109);
          if (uVar117 < 0x20) {
            if (uVar130 == 3) {
              if (uVar131 + 2 < uVar1) {
                uVar109 = 3;
                do {
                  uVar111 = uVar109;
                  bVar118 = puVar128[uVar111 - 2];
                  bVar112 = puVar128[uVar111 - 1];
                  bVar116 = puVar120[uVar111 + 1];
                  bVar3 = puVar120[uVar111 + 2];
                  uVar4 = puVar126[uVar111 - 2];
                  uVar5 = puVar126[uVar111 - 1];
                  puVar128[uVar111] =
                       (char)((uint)puVar120[uVar111] + (uint)puVar128[uVar111 - 3] >> 1) +
                       puVar126[uVar111 - 3];
                  puVar128[uVar111 + 1] = (char)((uint)bVar116 + (uint)bVar118 >> 1) + uVar4;
                  puVar128[uVar111 + 2] = (char)((uint)bVar3 + (uint)bVar112 >> 1) + uVar5;
                  uVar109 = uVar111 + 3;
                } while (uVar111 + 5 < uVar1);
              }
              else {
                uVar109 = 3;
                uVar111 = 0;
              }
            }
            else {
              if (uVar1 <= uVar131 + 1 || uVar130 == 1) goto LAB_001229a3;
              uVar109 = 2;
              do {
                uVar111 = uVar109;
                bVar118 = puVar128[uVar111 - 1];
                bVar112 = puVar120[uVar111 + 1];
                uVar4 = puVar123[uVar111 - 1];
                puVar128[uVar111] =
                     (char)((uint)puVar120[uVar111] + (uint)puVar128[uVar111 - 2] >> 1) +
                     puVar123[uVar111 - 2];
                puVar128[uVar111 + 1] = (char)((uint)bVar112 + (uint)bVar118 >> 1) + uVar4;
                uVar109 = uVar111 + 2;
              } while (uVar111 + 3 < uVar1);
            }
          }
          else if (uVar131 + 3 < uVar1) {
            uVar111 = 0;
            do {
              bVar118 = puVar128[uVar111 + 1];
              bVar112 = puVar128[uVar111 + 2];
              bVar116 = puVar128[uVar111 + 3];
              bVar3 = puVar120[uVar111 + uVar131 + 1];
              bVar119 = puVar120[uVar111 + uVar131 + 2];
              uVar4 = puVar127[uVar111 - 2];
              bVar124 = puVar120[uVar111 + uVar131 + 3];
              uVar5 = puVar127[uVar111 - 1];
              uVar6 = puVar127[uVar111];
              puVar110[uVar111 - 3] =
                   (char)((uint)puVar120[uVar111 + uVar131] + (uint)puVar128[uVar111] >> 1) +
                   puVar127[uVar111 - 3];
              puVar110[uVar111 - 2] = (char)((uint)bVar3 + (uint)bVar118 >> 1) + uVar4;
              puVar110[uVar111 - 1] = (char)((uint)bVar119 + (uint)bVar112 >> 1) + uVar5;
              puVar110[uVar111] = (char)((uint)bVar124 + (uint)bVar116 >> 1) + uVar6;
              lVar108 = uVar131 + uVar111;
              uVar111 = uVar111 + 4;
            } while (lVar108 + 7U < uVar1);
            uVar109 = uVar131 + uVar111;
          }
          else {
LAB_001229a3:
            uVar111 = 0;
            uVar109 = uVar131;
          }
        }
        if (uVar109 != uVar1) {
          lVar108 = 0;
          do {
            puVar128[lVar108 + uVar109] =
                 (char)((uint)puVar120[lVar108 + uVar109] + (uint)puVar128[lVar108 + uVar111] >> 1)
                 + puVar129[lVar108 + uVar109];
            lVar108 = lVar108 + 1;
          } while (uVar1 - uVar109 != lVar108);
        }
      }
      break;
    case '\x04':
      if (puVar120 == (uchar *)0x0) {
        if (7 < uVar117) {
          uVar109 = 0;
          do {
            puVar128[uVar109] = puVar129[uVar109];
            uVar109 = uVar109 + 1;
          } while (uVar131 != uVar109);
        }
        if (uVar1 != uVar131) {
          lVar108 = 0;
          do {
            puVar128[lVar108 + uVar131] = puVar128[lVar108] + puVar129[lVar108 + uVar131];
            lVar108 = lVar108 + 1;
          } while (lVar121 != lVar108);
        }
      }
      else {
        switch(uVar131) {
        case 1:
          if (uVar1 != 0) {
            bVar118 = 0;
            uVar109 = 0;
            uVar125 = 0;
            do {
              bVar112 = puVar120[uVar109];
              uVar106 = bVar112 - uVar125;
              uVar105 = -uVar106;
              if (0 < (int)uVar106) {
                uVar105 = uVar106;
              }
              uVar107 = bVar118 - uVar125;
              uVar106 = -uVar107;
              if (0 < (int)uVar107) {
                uVar106 = uVar107;
              }
              uVar149 = (uint)bVar118 + uVar125 * -2 + (uint)bVar112;
              uVar107 = -uVar149;
              if (0 < (int)uVar149) {
                uVar107 = uVar149;
              }
              uVar149 = uVar106 & 0xff;
              bVar116 = bVar112;
              if ((uVar105 & 0xff) <= (uVar106 & 0xff)) {
                uVar149 = uVar105 & 0xff;
                bVar116 = bVar118;
              }
              bVar118 = (byte)uVar125;
              if (uVar149 <= uVar107) {
                bVar118 = bVar116;
              }
              bVar118 = bVar118 + puVar129[uVar109];
              puVar128[uVar109] = bVar118;
              uVar109 = uVar109 + 1;
              uVar125 = (uint)bVar112;
            } while (uVar1 != uVar109);
            goto LAB_001229fc;
          }
LAB_001228a7:
          uVar111 = 0;
          break;
        case 2:
          if (uVar1 < 2) goto LAB_001228a7;
          bVar118 = 0;
          uVar106 = 0;
          uVar109 = 1;
          uVar125 = 0;
          uVar105 = 0;
          do {
            uVar111 = uVar109;
            uVar151 = (uint)puVar120[uVar111 - 1];
            uVar149 = uVar151 - uVar125;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            uVar152 = uVar106 - uVar125;
            uVar149 = -uVar152;
            if (0 < (int)uVar152) {
              uVar149 = uVar152;
            }
            uVar153 = uVar106 + uVar125 * -2 + (uint)puVar120[uVar111 - 1];
            uVar152 = -uVar153;
            if (0 < (int)uVar153) {
              uVar152 = uVar153;
            }
            uVar153 = uVar149 & 0xff;
            uVar162 = uVar151;
            if ((uVar107 & 0xff) <= (uVar149 & 0xff)) {
              uVar153 = uVar107 & 0xff;
              uVar162 = uVar106;
            }
            cVar113 = (char)uVar125;
            if (uVar153 <= uVar152) {
              cVar113 = (char)uVar162;
            }
            bVar112 = puVar120[uVar111];
            uVar106 = bVar112 - uVar105;
            uVar125 = -uVar106;
            if (0 < (int)uVar106) {
              uVar125 = uVar106;
            }
            uVar107 = bVar118 - uVar105;
            uVar106 = -uVar107;
            if (0 < (int)uVar107) {
              uVar106 = uVar107;
            }
            uVar149 = (uint)bVar118 + uVar105 * -2 + (uint)bVar112;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            uVar149 = uVar106 & 0xff;
            bVar116 = bVar112;
            if ((uVar125 & 0xff) <= (uVar106 & 0xff)) {
              uVar149 = uVar125 & 0xff;
              bVar116 = bVar118;
            }
            bVar118 = (byte)uVar105;
            if (uVar149 <= uVar107) {
              bVar118 = bVar116;
            }
            uVar4 = puVar129[uVar111 - 1];
            bVar118 = bVar118 + puVar129[uVar111];
            puVar128[uVar111 - 1] = cVar113 + uVar4;
            puVar128[uVar111] = bVar118;
            uVar106 = (uint)(byte)(cVar113 + uVar4);
            uVar109 = uVar111 + 2;
            uVar125 = uVar151;
            uVar105 = (uint)bVar112;
          } while (uVar111 + 2 < uVar1);
          uVar111 = uVar111 + 1;
          break;
        case 3:
          if (uVar1 < 3) goto LAB_001228a7;
          bVar116 = 0;
          bVar112 = 0;
          bVar118 = 0;
          uVar109 = 0;
          uVar125 = 0;
          uVar105 = 0;
          uVar106 = 0;
          do {
            bVar3 = puVar120[uVar109];
            uVar149 = bVar3 - uVar125;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            uVar151 = bVar118 - uVar125;
            uVar149 = -uVar151;
            if (0 < (int)uVar151) {
              uVar149 = uVar151;
            }
            uVar152 = (uint)bVar118 + uVar125 * -2 + (uint)bVar3;
            uVar151 = -uVar152;
            if (0 < (int)uVar152) {
              uVar151 = uVar152;
            }
            uVar152 = uVar149 & 0xff;
            bVar119 = bVar3;
            if ((uVar107 & 0xff) <= (uVar149 & 0xff)) {
              uVar152 = uVar107 & 0xff;
              bVar119 = bVar118;
            }
            bVar118 = (byte)uVar125;
            if (uVar152 <= uVar151) {
              bVar118 = bVar119;
            }
            bVar119 = puVar120[uVar109 + 1];
            uVar107 = bVar119 - uVar105;
            uVar125 = -uVar107;
            if (0 < (int)uVar107) {
              uVar125 = uVar107;
            }
            uVar149 = bVar112 - uVar105;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            uVar151 = (uint)bVar112 + uVar105 * -2 + (uint)bVar119;
            uVar149 = -uVar151;
            if (0 < (int)uVar151) {
              uVar149 = uVar151;
            }
            uVar151 = uVar107 & 0xff;
            bVar124 = bVar119;
            if ((uVar125 & 0xff) <= (uVar107 & 0xff)) {
              uVar151 = uVar125 & 0xff;
              bVar124 = bVar112;
            }
            bVar112 = (byte)uVar105;
            if (uVar151 <= uVar149) {
              bVar112 = bVar124;
            }
            uVar107 = (uint)puVar120[uVar109 + 2];
            uVar105 = uVar107 - uVar106;
            uVar125 = -uVar105;
            if (0 < (int)uVar105) {
              uVar125 = uVar105;
            }
            uVar149 = bVar116 - uVar106;
            uVar105 = -uVar149;
            if (0 < (int)uVar149) {
              uVar105 = uVar149;
            }
            uVar151 = (uint)bVar116 + uVar106 * -2 + (uint)puVar120[uVar109 + 2];
            uVar149 = -uVar151;
            if (0 < (int)uVar151) {
              uVar149 = uVar151;
            }
            uVar152 = uVar105 & 0xff;
            uVar151 = uVar107;
            if ((uVar125 & 0xff) <= (uVar105 & 0xff)) {
              uVar152 = uVar125 & 0xff;
              uVar151 = (uint)bVar116;
            }
            if (uVar152 <= uVar149) {
              uVar106 = uVar151;
            }
            bVar118 = bVar118 + puVar129[uVar109];
            bVar112 = bVar112 + puVar129[uVar109 + 1];
            bVar116 = (char)uVar106 + puVar129[uVar109 + 2];
            puVar128[uVar109] = bVar118;
            puVar128[uVar109 + 1] = bVar112;
            puVar128[uVar109 + 2] = bVar116;
            uVar111 = uVar109 + 3;
            uVar114 = uVar109 + 5;
            uVar109 = uVar111;
            uVar125 = (uint)bVar3;
            uVar105 = (uint)bVar119;
            uVar106 = uVar107;
          } while (uVar114 < uVar1);
          break;
        case 4:
          if (uVar1 < 4) goto LAB_001228a7;
          auVar138 = (undefined1  [16])0x0;
          uVar109 = 0;
          auVar137 = (undefined1  [16])0x0;
          do {
            Var55 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar137[3]);
            auVar96._9_6_ = 0;
            auVar96._0_9_ = Var55;
            auVar78._1_10_ = SUB1510(auVar96 << 0x30,5);
            auVar78[0] = auVar137[2];
            auVar97._11_4_ = 0;
            auVar97._0_11_ = auVar78;
            auVar79._1_12_ = SUB1512(auVar97 << 0x20,3);
            auVar79[0] = auVar137[1];
            uVar141 = CONCAT11(0,auVar137[0]);
            auVar53._2_13_ = auVar79;
            auVar53._0_2_ = uVar141;
            auVar17._10_2_ = 0;
            auVar17._0_10_ = auVar53._0_10_;
            auVar17._12_2_ = (short)Var55;
            uVar101 = CONCAT42(auVar17._10_4_,auVar78._0_2_);
            auVar80._6_8_ = 0;
            auVar80._0_6_ = uVar101;
            Var59 = CONCAT82(SUB148(auVar80 << 0x40,6),auVar79._0_2_);
            auVar144._0_4_ = CONCAT22(0,uVar141);
            auVar144._4_10_ = Var59;
            auVar144._14_2_ = 0;
            auVar18[0xd] = 0;
            auVar18._0_13_ = auVar138._0_13_;
            auVar18[0xe] = auVar138[7];
            auVar24[0xc] = auVar138[6];
            auVar24._0_12_ = auVar138._0_12_;
            auVar24._13_2_ = auVar18._13_2_;
            auVar29[0xb] = 0;
            auVar29._0_11_ = auVar138._0_11_;
            auVar29._12_3_ = auVar24._12_3_;
            auVar34[10] = auVar138[5];
            auVar34._0_10_ = auVar138._0_10_;
            auVar34._11_4_ = auVar29._11_4_;
            auVar39[9] = 0;
            auVar39._0_9_ = auVar138._0_9_;
            auVar39._10_5_ = auVar34._10_5_;
            auVar44[8] = auVar138[4];
            auVar44._0_8_ = auVar138._0_8_;
            auVar44._9_6_ = auVar39._9_6_;
            auVar81._7_8_ = 0;
            auVar81._0_7_ = auVar44._8_7_;
            Var55 = CONCAT81(SUB158(auVar81 << 0x40,7),auVar138[3]);
            auVar98._9_6_ = 0;
            auVar98._0_9_ = Var55;
            auVar82._1_10_ = SUB1510(auVar98 << 0x30,5);
            auVar82[0] = auVar138[2];
            auVar99._11_4_ = 0;
            auVar99._0_11_ = auVar82;
            auVar83._1_12_ = SUB1512(auVar99 << 0x20,3);
            auVar83[0] = auVar138[1];
            uVar141 = CONCAT11(0,auVar138[0]);
            auVar54._2_13_ = auVar83;
            auVar54._0_2_ = uVar141;
            auVar19._10_2_ = 0;
            auVar19._0_10_ = auVar54._0_10_;
            auVar19._12_2_ = (short)Var55;
            uVar102 = CONCAT42(auVar19._10_4_,auVar82._0_2_);
            auVar84._6_8_ = 0;
            auVar84._0_6_ = uVar102;
            uVar149 = (uint)uVar141;
            uVar125 = *(uint *)(puVar120 + uVar109);
            auVar46[0xc] = (char)(uVar125 >> 0x18);
            auVar46._0_12_ = ZEXT712(0);
            uVar64 = CONCAT32(auVar46._10_3_,(ushort)(byte)(uVar125 >> 0x10));
            auVar100._5_8_ = 0;
            auVar100._0_5_ = uVar64;
            Var65 = CONCAT72(SUB137(auVar100 << 0x40,6),(ushort)(byte)(uVar125 >> 8));
            auVar160._0_4_ = uVar125 & 0xff;
            auVar160._4_9_ = Var65;
            auVar160._13_3_ = 0;
            uVar163 = (uint)Var59;
            iVar169 = (int)Var65;
            iVar145 = (int)uVar101;
            iVar171 = (int)uVar64;
            uVar106 = (uint)(uint3)(auVar46._10_3_ >> 0x10);
            uVar105 = auVar17._10_4_ >> 0x10;
            uVar164 = (uint)CONCAT82(SUB148(auVar84 << 0x40,6),auVar83._0_2_);
            iVar150 = (int)uVar102;
            uVar107 = auVar19._10_4_ >> 0x10;
            uVar7 = *(undefined4 *)(puVar129 + uVar109);
            auVar135 = auVar144 | auVar104;
            uVar151 = uVar149 + auVar144._0_4_ * -2 + auVar160._0_4_;
            uVar152 = uVar164 + uVar163 * -2 + iVar169;
            uVar153 = iVar150 + iVar145 * -2 + iVar171;
            uVar162 = uVar107 + uVar105 * -2 + uVar106;
            auVar136 = auVar160 ^ auVar104;
            uVar165 = -(uint)(auVar135._0_4_ < auVar136._0_4_);
            uVar170 = -(uint)(auVar135._4_4_ < auVar136._4_4_);
            uVar172 = -(uint)(auVar135._8_4_ < auVar136._8_4_);
            uVar173 = -(uint)(auVar135._12_4_ < auVar136._12_4_);
            auVar161._0_4_ = uVar165 - (auVar160._0_4_ - auVar144._0_4_ ^ uVar165);
            auVar161._4_4_ = uVar170 - (iVar169 - uVar163 ^ uVar170);
            auVar161._8_4_ = uVar172 - (iVar171 - iVar145 ^ uVar172);
            auVar161._12_4_ = uVar173 - (uVar106 - uVar105 ^ uVar173);
            auVar148._0_4_ =
                 -(uint)(auVar144._0_4_ < uVar149) -
                 (uVar149 - auVar144._0_4_ ^ -(uint)(auVar144._0_4_ < uVar149));
            auVar148._4_4_ =
                 -(uint)(uVar163 < uVar164) - (uVar164 - uVar163 ^ -(uint)(uVar163 < uVar164));
            auVar148._8_4_ =
                 -(uint)(iVar145 < iVar150) - (iVar150 - iVar145 ^ -(uint)(iVar145 < iVar150));
            auVar148._12_4_ =
                 -(uint)(uVar105 < uVar107) - (uVar107 - uVar105 ^ -(uint)(uVar105 < uVar107));
            uVar105 = (int)uVar151 >> 0x1f;
            uVar106 = (int)uVar152 >> 0x1f;
            uVar107 = (int)uVar153 >> 0x1f;
            uVar149 = (int)uVar162 >> 0x1f;
            auVar168._0_4_ = -(uint)(auVar148._0_4_ < auVar161._0_4_);
            auVar168._4_4_ = -(uint)(auVar148._4_4_ < auVar161._4_4_);
            auVar168._8_4_ = -(uint)(auVar148._8_4_ < auVar161._8_4_);
            auVar168._12_4_ = -(uint)(auVar148._12_4_ < auVar161._12_4_);
            auVar136 = packssdw(auVar168,auVar168);
            auVar135 = packsswb(auVar136,auVar136);
            auVar175 = auVar148 ^ auVar104;
            auVar136 = auVar161 ^ auVar104;
            auVar139._0_4_ = -(uint)(auVar175._0_4_ < auVar136._0_4_);
            auVar139._4_4_ = -(uint)(auVar175._4_4_ < auVar136._4_4_);
            auVar139._8_4_ = -(uint)(auVar175._8_4_ < auVar136._8_4_);
            auVar139._12_4_ = -(uint)(auVar175._12_4_ < auVar136._12_4_);
            auVar136 = ~auVar139 & auVar161 | auVar148 & auVar139;
            auVar140._0_4_ = -(uint)((int)((uVar151 ^ uVar105) - uVar105) < auVar136._0_4_);
            auVar140._4_4_ = -(uint)((int)((uVar152 ^ uVar106) - uVar106) < auVar136._4_4_);
            auVar140._8_4_ = -(uint)((int)((uVar153 ^ uVar107) - uVar107) < auVar136._8_4_);
            auVar140._12_4_ = -(uint)((int)((uVar162 ^ uVar149) - uVar149) < auVar136._12_4_);
            auVar136 = packssdw(auVar140,auVar140);
            auVar136 = packsswb(auVar136,auVar136);
            auVar137 = ~auVar136 & (~auVar135 & auVar138 | ZEXT416(uVar125) & auVar135) |
                       auVar137 & auVar136;
            auVar138._0_4_ =
                 CONCAT13(auVar137[3] + (char)((uint)uVar7 >> 0x18),
                          CONCAT12(auVar137[2] + (char)((uint)uVar7 >> 0x10),
                                   CONCAT11(auVar137[1] + (char)((uint)uVar7 >> 8),
                                            auVar137[0] + (char)uVar7)));
            auVar138[4] = auVar137[4];
            auVar138[5] = auVar137[5];
            auVar138[6] = auVar137[6];
            auVar138[7] = auVar137[7];
            auVar138[8] = auVar137[8];
            auVar138[9] = auVar137[9];
            auVar138[10] = auVar137[10];
            auVar138[0xb] = auVar137[0xb];
            auVar138[0xc] = auVar137[0xc];
            auVar138[0xd] = auVar137[0xd];
            auVar138[0xe] = auVar137[0xe];
            auVar138[0xf] = auVar137[0xf];
            *(undefined4 *)(puVar128 + uVar109) = auVar138._0_4_;
            uVar111 = uVar109 + 4;
            uVar114 = uVar109 + 7;
            uVar109 = uVar111;
            auVar137 = ZEXT416(uVar125);
          } while (uVar114 < uVar1);
          break;
        default:
          uVar109 = 0;
          do {
            puVar128[uVar109] = puVar120[uVar109] + puVar129[uVar109];
            uVar109 = uVar109 + 1;
          } while (uVar131 != uVar109);
        case 0:
          uVar111 = uVar131;
          break;
        case 6:
          if (uVar1 < 6) goto LAB_001228a7;
          auVar132 = (undefined1  [16])0x0;
          bVar112 = 0;
          bVar118 = 0;
          uVar109 = 5;
          auVar137 = (undefined1  [16])0x0;
          uVar125 = 0;
          uVar105 = 0;
          do {
            uVar111 = uVar109;
            bVar116 = puVar120[uVar111 - 1];
            uVar107 = bVar116 - uVar125;
            uVar106 = -uVar107;
            if (0 < (int)uVar107) {
              uVar106 = uVar107;
            }
            uVar106 = uVar106 & 0xff;
            uVar149 = bVar118 - uVar125;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            uVar107 = uVar107 & 0xff;
            uVar151 = (uint)bVar118 + uVar125 * -2 + (uint)bVar116;
            uVar149 = -uVar151;
            if (0 < (int)uVar151) {
              uVar149 = uVar151;
            }
            uVar151 = uVar107;
            if (uVar106 <= uVar107) {
              uVar151 = uVar106;
            }
            bVar3 = puVar120[uVar111];
            if (uVar106 > uVar107) {
              bVar118 = bVar116;
            }
            if (uVar149 < uVar151) {
              bVar118 = (byte)uVar125;
            }
            bVar118 = bVar118 + puVar129[uVar111 - 1];
            uVar106 = bVar3 - uVar105;
            uVar125 = -uVar106;
            if (0 < (int)uVar106) {
              uVar125 = uVar106;
            }
            uVar125 = uVar125 & 0xff;
            uVar107 = bVar112 - uVar105;
            uVar106 = -uVar107;
            if (0 < (int)uVar107) {
              uVar106 = uVar107;
            }
            uVar149 = (uint)bVar112 + uVar105 * -2 + (uint)bVar3;
            uVar107 = -uVar149;
            if (0 < (int)uVar149) {
              uVar107 = uVar149;
            }
            if ((uVar106 & 0xff) < uVar125) {
              bVar112 = bVar3;
              uVar125 = uVar106 & 0xff;
            }
            if (uVar107 < uVar125) {
              bVar112 = (byte)uVar105;
            }
            Var55 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar137[3]);
            auVar85._9_6_ = 0;
            auVar85._0_9_ = Var55;
            auVar56._1_10_ = SUB1510(auVar85 << 0x30,5);
            auVar56[0] = auVar137[2];
            auVar86._11_4_ = 0;
            auVar86._0_11_ = auVar56;
            auVar57._1_12_ = SUB1512(auVar86 << 0x20,3);
            auVar57[0] = auVar137[1];
            uVar141 = CONCAT11(0,auVar137[0]);
            auVar48._2_13_ = auVar57;
            auVar48._0_2_ = uVar141;
            auVar8._10_2_ = 0;
            auVar8._0_10_ = auVar48._0_10_;
            auVar8._12_2_ = (short)Var55;
            uVar101 = CONCAT42(auVar8._10_4_,auVar56._0_2_);
            auVar58._6_8_ = 0;
            auVar58._0_6_ = uVar101;
            Var59 = CONCAT82(SUB148(auVar58 << 0x40,6),auVar57._0_2_);
            auVar143._0_4_ = CONCAT22(0,uVar141);
            auVar143._4_10_ = Var59;
            auVar143._14_2_ = 0;
            auVar9[0xd] = 0;
            auVar9._0_13_ = auVar132._0_13_;
            auVar9[0xe] = auVar132[7];
            auVar20[0xc] = auVar132[6];
            auVar20._0_12_ = auVar132._0_12_;
            auVar20._13_2_ = auVar9._13_2_;
            auVar25[0xb] = 0;
            auVar25._0_11_ = auVar132._0_11_;
            auVar25._12_3_ = auVar20._12_3_;
            auVar30[10] = auVar132[5];
            auVar30._0_10_ = auVar132._0_10_;
            auVar30._11_4_ = auVar25._11_4_;
            auVar35[9] = 0;
            auVar35._0_9_ = auVar132._0_9_;
            auVar35._10_5_ = auVar30._10_5_;
            auVar40[8] = auVar132[4];
            auVar40._0_8_ = auVar132._0_8_;
            auVar40._9_6_ = auVar35._9_6_;
            auVar60._7_8_ = 0;
            auVar60._0_7_ = auVar40._8_7_;
            Var55 = CONCAT81(SUB158(auVar60 << 0x40,7),auVar132[3]);
            auVar87._9_6_ = 0;
            auVar87._0_9_ = Var55;
            auVar61._1_10_ = SUB1510(auVar87 << 0x30,5);
            auVar61[0] = auVar132[2];
            auVar88._11_4_ = 0;
            auVar88._0_11_ = auVar61;
            auVar62._1_12_ = SUB1512(auVar88 << 0x20,3);
            auVar62[0] = auVar132[1];
            uVar141 = CONCAT11(0,auVar132[0]);
            auVar49._2_13_ = auVar62;
            auVar49._0_2_ = uVar141;
            bVar112 = bVar112 + puVar129[uVar111];
            auVar10._10_2_ = 0;
            auVar10._0_10_ = auVar49._0_10_;
            auVar10._12_2_ = (short)Var55;
            uVar102 = CONCAT42(auVar10._10_4_,auVar61._0_2_);
            auVar63._6_8_ = 0;
            auVar63._0_6_ = uVar102;
            uVar149 = (uint)uVar141;
            uVar125 = *(uint *)(puVar120 + (uVar111 - 5));
            auVar45[0xc] = (char)(uVar125 >> 0x18);
            auVar45._0_12_ = ZEXT712(0);
            uVar64 = CONCAT32(auVar45._10_3_,(ushort)(byte)(uVar125 >> 0x10));
            auVar89._5_8_ = 0;
            auVar89._0_5_ = uVar64;
            Var65 = CONCAT72(SUB137(auVar89 << 0x40,6),(ushort)(byte)(uVar125 >> 8));
            auVar154._0_4_ = uVar125 & 0xff;
            auVar154._4_9_ = Var65;
            auVar154._13_3_ = 0;
            uVar163 = (uint)Var59;
            iVar169 = (int)Var65;
            iVar145 = (int)uVar101;
            iVar171 = (int)uVar64;
            uVar106 = (uint)(uint3)(auVar45._10_3_ >> 0x10);
            uVar105 = auVar8._10_4_ >> 0x10;
            uVar164 = (uint)CONCAT82(SUB148(auVar63 << 0x40,6),auVar62._0_2_);
            iVar150 = (int)uVar102;
            uVar107 = auVar10._10_4_ >> 0x10;
            uVar7 = *(undefined4 *)(puVar129 + (uVar111 - 5));
            auVar135 = auVar143 | auVar104;
            uVar151 = uVar149 + auVar143._0_4_ * -2 + auVar154._0_4_;
            uVar152 = uVar164 + uVar163 * -2 + iVar169;
            uVar153 = iVar150 + iVar145 * -2 + iVar171;
            uVar162 = uVar107 + uVar105 * -2 + uVar106;
            auVar136 = auVar154 ^ auVar104;
            uVar165 = -(uint)(auVar135._0_4_ < auVar136._0_4_);
            uVar170 = -(uint)(auVar135._4_4_ < auVar136._4_4_);
            uVar172 = -(uint)(auVar135._8_4_ < auVar136._8_4_);
            uVar173 = -(uint)(auVar135._12_4_ < auVar136._12_4_);
            auVar155._0_4_ = uVar165 - (auVar154._0_4_ - auVar143._0_4_ ^ uVar165);
            auVar155._4_4_ = uVar170 - (iVar169 - uVar163 ^ uVar170);
            auVar155._8_4_ = uVar172 - (iVar171 - iVar145 ^ uVar172);
            auVar155._12_4_ = uVar173 - (uVar106 - uVar105 ^ uVar173);
            auVar146._0_4_ =
                 -(uint)(auVar143._0_4_ < uVar149) -
                 (uVar149 - auVar143._0_4_ ^ -(uint)(auVar143._0_4_ < uVar149));
            auVar146._4_4_ =
                 -(uint)(uVar163 < uVar164) - (uVar164 - uVar163 ^ -(uint)(uVar163 < uVar164));
            auVar146._8_4_ =
                 -(uint)(iVar145 < iVar150) - (iVar150 - iVar145 ^ -(uint)(iVar145 < iVar150));
            auVar146._12_4_ =
                 -(uint)(uVar105 < uVar107) - (uVar107 - uVar105 ^ -(uint)(uVar105 < uVar107));
            uVar105 = (int)uVar151 >> 0x1f;
            uVar106 = (int)uVar152 >> 0x1f;
            uVar107 = (int)uVar153 >> 0x1f;
            uVar149 = (int)uVar162 >> 0x1f;
            auVar166._0_4_ = -(uint)(auVar146._0_4_ < auVar155._0_4_);
            auVar166._4_4_ = -(uint)(auVar146._4_4_ < auVar155._4_4_);
            auVar166._8_4_ = -(uint)(auVar146._8_4_ < auVar155._8_4_);
            auVar166._12_4_ = -(uint)(auVar146._12_4_ < auVar155._12_4_);
            auVar136 = packssdw(auVar166,auVar166);
            auVar135 = packsswb(auVar136,auVar136);
            auVar175 = auVar146 ^ auVar104;
            auVar136 = auVar155 ^ auVar104;
            auVar133._0_4_ = -(uint)(auVar175._0_4_ < auVar136._0_4_);
            auVar133._4_4_ = -(uint)(auVar175._4_4_ < auVar136._4_4_);
            auVar133._8_4_ = -(uint)(auVar175._8_4_ < auVar136._8_4_);
            auVar133._12_4_ = -(uint)(auVar175._12_4_ < auVar136._12_4_);
            auVar136 = ~auVar133 & auVar155 | auVar146 & auVar133;
            auVar134._0_4_ = -(uint)((int)((uVar151 ^ uVar105) - uVar105) < auVar136._0_4_);
            auVar134._4_4_ = -(uint)((int)((uVar152 ^ uVar106) - uVar106) < auVar136._4_4_);
            auVar134._8_4_ = -(uint)((int)((uVar153 ^ uVar107) - uVar107) < auVar136._8_4_);
            auVar134._12_4_ = -(uint)((int)((uVar162 ^ uVar149) - uVar149) < auVar136._12_4_);
            auVar136 = packssdw(auVar134,auVar134);
            auVar136 = packsswb(auVar136,auVar136);
            auVar137 = ~auVar136 & (~auVar135 & auVar132 | ZEXT416(uVar125) & auVar135) |
                       auVar137 & auVar136;
            auVar132._0_4_ =
                 CONCAT13(auVar137[3] + (char)((uint)uVar7 >> 0x18),
                          CONCAT12(auVar137[2] + (char)((uint)uVar7 >> 0x10),
                                   CONCAT11(auVar137[1] + (char)((uint)uVar7 >> 8),
                                            auVar137[0] + (char)uVar7)));
            auVar132[4] = auVar137[4];
            auVar132[5] = auVar137[5];
            auVar132[6] = auVar137[6];
            auVar132[7] = auVar137[7];
            auVar132[8] = auVar137[8];
            auVar132[9] = auVar137[9];
            auVar132[10] = auVar137[10];
            auVar132[0xb] = auVar137[0xb];
            auVar132[0xc] = auVar137[0xc];
            auVar132[0xd] = auVar137[0xd];
            auVar132[0xe] = auVar137[0xe];
            auVar132[0xf] = auVar137[0xf];
            *(undefined4 *)(puVar128 + (uVar111 - 5)) = auVar132._0_4_;
            puVar128[uVar111 - 1] = bVar118;
            puVar128[uVar111] = bVar112;
            uVar109 = uVar111 + 6;
            auVar137 = ZEXT416(uVar125);
            uVar125 = (uint)bVar116;
            uVar105 = (uint)bVar3;
          } while (uVar111 + 6 < uVar1);
          uVar111 = uVar111 + 1;
          break;
        case 8:
          if (uVar1 < 8) goto LAB_001228a7;
          auVar136 = (undefined1  [16])0x0;
          uVar109 = 0;
          auVar137 = (undefined1  [16])0x0;
          do {
            auVar11[0xd] = 0;
            auVar11._0_13_ = auVar137._0_13_;
            auVar11[0xe] = auVar137[7];
            auVar21[0xc] = auVar137[6];
            auVar21._0_12_ = auVar137._0_12_;
            auVar21._13_2_ = auVar11._13_2_;
            auVar26[0xb] = 0;
            auVar26._0_11_ = auVar137._0_11_;
            auVar26._12_3_ = auVar21._12_3_;
            auVar31[10] = auVar137[5];
            auVar31._0_10_ = auVar137._0_10_;
            auVar31._11_4_ = auVar26._11_4_;
            auVar36[9] = 0;
            auVar36._0_9_ = auVar137._0_9_;
            auVar36._10_5_ = auVar31._10_5_;
            auVar41[8] = auVar137[4];
            auVar41._0_8_ = auVar137._0_8_;
            auVar41._9_6_ = auVar36._9_6_;
            auVar66._7_8_ = 0;
            auVar66._0_7_ = auVar41._8_7_;
            Var55 = CONCAT81(SUB158(auVar66 << 0x40,7),auVar137[3]);
            auVar90._9_6_ = 0;
            auVar90._0_9_ = Var55;
            auVar67._1_10_ = SUB1510(auVar90 << 0x30,5);
            auVar67[0] = auVar137[2];
            auVar91._11_4_ = 0;
            auVar91._0_11_ = auVar67;
            auVar68._1_12_ = SUB1512(auVar91 << 0x20,3);
            auVar68[0] = auVar137[1];
            uVar141 = CONCAT11(0,auVar137[0]);
            auVar50._2_13_ = auVar68;
            auVar50._0_2_ = uVar141;
            auVar12._10_2_ = 0;
            auVar12._0_10_ = auVar50._0_10_;
            auVar12._12_2_ = (short)Var55;
            uVar101 = CONCAT42(auVar12._10_4_,auVar67._0_2_);
            auVar69._6_8_ = 0;
            auVar69._0_6_ = uVar101;
            uVar180 = (uint)uVar141;
            uVar179 = (uint)auVar41._8_2_;
            uVar178 = auVar21._12_2_;
            uVar141 = auVar11._13_2_ >> 8;
            auVar13[0xd] = 0;
            auVar13._0_13_ = auVar136._0_13_;
            auVar13[0xe] = auVar136[7];
            auVar22[0xc] = auVar136[6];
            auVar22._0_12_ = auVar136._0_12_;
            auVar22._13_2_ = auVar13._13_2_;
            auVar27[0xb] = 0;
            auVar27._0_11_ = auVar136._0_11_;
            auVar27._12_3_ = auVar22._12_3_;
            uVar107 = auVar27._11_4_;
            auVar32[10] = auVar136[5];
            auVar32._0_10_ = auVar136._0_10_;
            auVar32._11_4_ = uVar107;
            auVar37[9] = 0;
            auVar37._0_9_ = auVar136._0_9_;
            auVar37._10_5_ = auVar32._10_5_;
            auVar42[8] = auVar136[4];
            auVar42._0_8_ = auVar136._0_8_;
            auVar42._9_6_ = auVar37._9_6_;
            auVar70._7_8_ = 0;
            auVar70._0_7_ = auVar42._8_7_;
            Var55 = CONCAT81(SUB158(auVar70 << 0x40,7),auVar136[3]);
            auVar92._9_6_ = 0;
            auVar92._0_9_ = Var55;
            auVar71._1_10_ = SUB1510(auVar92 << 0x30,5);
            auVar71[0] = auVar136[2];
            auVar93._11_4_ = 0;
            auVar93._0_11_ = auVar71;
            auVar72._1_12_ = SUB1512(auVar93 << 0x20,3);
            auVar72[0] = auVar136[1];
            uVar142 = CONCAT11(0,auVar136[0]);
            auVar51._2_13_ = auVar72;
            auVar51._0_2_ = uVar142;
            auVar14._10_2_ = 0;
            auVar14._0_10_ = auVar51._0_10_;
            auVar14._12_2_ = (short)Var55;
            uVar102 = CONCAT42(auVar14._10_4_,auVar71._0_2_);
            auVar73._6_8_ = 0;
            auVar73._0_6_ = uVar102;
            uVar111 = *(ulong *)(puVar120 + uVar109);
            auVar135._8_8_ = 0;
            auVar135._0_8_ = uVar111;
            auVar15._8_6_ = 0;
            auVar15._0_8_ = uVar111;
            auVar15[0xe] = (char)(uVar111 >> 0x38);
            auVar23._8_4_ = 0;
            auVar23._0_8_ = uVar111;
            auVar23[0xc] = (char)(uVar111 >> 0x30);
            auVar23._13_2_ = auVar15._13_2_;
            auVar28._8_4_ = 0;
            auVar28._0_8_ = uVar111;
            auVar28._12_3_ = auVar23._12_3_;
            auVar33._8_2_ = 0;
            auVar33._0_8_ = uVar111;
            auVar33[10] = (char)(uVar111 >> 0x28);
            auVar33._11_4_ = auVar28._11_4_;
            auVar38._8_2_ = 0;
            auVar38._0_8_ = uVar111;
            auVar38._10_5_ = auVar33._10_5_;
            auVar43[8] = (char)(uVar111 >> 0x20);
            auVar43._0_8_ = uVar111;
            auVar43._9_6_ = auVar38._9_6_;
            auVar74._7_8_ = 0;
            auVar74._0_7_ = auVar43._8_7_;
            Var55 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)(uVar111 >> 0x18));
            auVar94._9_6_ = 0;
            auVar94._0_9_ = Var55;
            auVar75._1_10_ = SUB1510(auVar94 << 0x30,5);
            auVar75[0] = (char)(uVar111 >> 0x10);
            auVar95._11_4_ = 0;
            auVar95._0_11_ = auVar75;
            auVar76._1_12_ = SUB1512(auVar95 << 0x20,3);
            auVar76[0] = (char)(uVar111 >> 8);
            uVar184 = CONCAT11(0,(byte)uVar111);
            auVar52._2_13_ = auVar76;
            auVar52._0_2_ = uVar184;
            auVar16._10_2_ = 0;
            auVar16._0_10_ = auVar52._0_10_;
            auVar16._12_2_ = (short)Var55;
            uVar103 = CONCAT42(auVar16._10_4_,auVar75._0_2_);
            auVar77._6_8_ = 0;
            auVar77._0_6_ = uVar103;
            uVar47 = auVar15._13_2_ >> 8;
            uVar106 = auVar43._8_2_ - uVar179;
            uVar177 = (uint)auVar31._10_2_;
            uVar149 = auVar33._10_2_ - uVar177;
            uVar151 = (uint)auVar23._12_2_ - (uint)uVar178;
            uVar152 = (uint)uVar47 - (uint)uVar141;
            uVar153 = uVar184 - uVar180;
            iVar145 = (int)CONCAT82(SUB148(auVar77 << 0x40,6),auVar76._0_2_);
            iVar182 = (int)CONCAT82(SUB148(auVar69 << 0x40,6),auVar68._0_2_);
            uVar162 = iVar145 - iVar182;
            iVar150 = (int)uVar103;
            uVar125 = auVar16._10_4_ >> 0x10;
            iVar183 = (int)uVar101;
            uVar163 = iVar150 - iVar183;
            uVar105 = auVar12._10_4_ >> 0x10;
            uVar164 = uVar125 - uVar105;
            uVar165 = (int)uVar153 >> 0x1f;
            uVar170 = (int)uVar162 >> 0x1f;
            uVar172 = (int)uVar163 >> 0x1f;
            uVar173 = (int)uVar164 >> 0x1f;
            auVar156._0_4_ = (uVar153 ^ uVar165) - uVar165;
            auVar156._4_4_ = (uVar162 ^ uVar170) - uVar170;
            auVar156._8_4_ = (uVar163 ^ uVar172) - uVar172;
            auVar156._12_4_ = (uVar164 ^ uVar173) - uVar173;
            uVar153 = (int)uVar106 >> 0x1f;
            uVar162 = (int)uVar149 >> 0x1f;
            uVar163 = (int)uVar151 >> 0x1f;
            uVar164 = (int)uVar152 >> 0x1f;
            auVar147._0_4_ = (uVar106 ^ uVar153) - uVar153;
            auVar147._4_4_ = (uVar149 ^ uVar162) - uVar162;
            auVar147._8_4_ = (uVar151 ^ uVar163) - uVar163;
            auVar147._12_4_ = (uVar152 ^ uVar164) - uVar164;
            uVar149 = auVar42._8_2_ - uVar179;
            uVar151 = auVar32._10_2_ - uVar177;
            uVar153 = uVar107 >> 8 & 0xffff;
            uVar152 = uVar153 - uVar178;
            uVar162 = (uVar107 >> 0x18) - (uint)uVar141;
            uVar163 = uVar142 - uVar180;
            iVar169 = (int)CONCAT82(SUB148(auVar73 << 0x40,6),auVar72._0_2_);
            uVar164 = iVar169 - iVar182;
            iVar171 = (int)uVar102;
            uVar106 = auVar14._10_4_ >> 0x10;
            uVar165 = iVar171 - iVar183;
            uVar170 = uVar106 - uVar105;
            uVar172 = (int)uVar163 >> 0x1f;
            uVar173 = (int)uVar164 >> 0x1f;
            uVar185 = (int)uVar165 >> 0x1f;
            uVar186 = (int)uVar170 >> 0x1f;
            auVar174._0_4_ = (uVar163 ^ uVar172) - uVar172;
            auVar174._4_4_ = (uVar164 ^ uVar173) - uVar173;
            auVar174._8_4_ = (uVar165 ^ uVar185) - uVar185;
            auVar174._12_4_ = (uVar170 ^ uVar186) - uVar186;
            uVar163 = (int)uVar149 >> 0x1f;
            uVar164 = (int)uVar151 >> 0x1f;
            uVar165 = (int)uVar152 >> 0x1f;
            uVar170 = (int)uVar162 >> 0x1f;
            auVar167._0_4_ = (uVar149 ^ uVar163) - uVar163;
            auVar167._4_4_ = (uVar151 ^ uVar164) - uVar164;
            auVar167._8_4_ = (uVar152 ^ uVar165) - uVar165;
            auVar167._12_4_ = (uVar162 ^ uVar170) - uVar170;
            uVar149 = (uint)auVar42._8_2_ + uVar179 * -2 + (uint)auVar43._8_2_;
            uVar151 = (uint)auVar32._10_2_ + uVar177 * -2 + (uint)auVar33._10_2_;
            uVar152 = uVar153 + (uint)uVar178 * -2 + (uint)auVar23._12_2_;
            uVar107 = (uVar107 >> 0x18) + (uint)uVar141 * -2 + (uint)uVar47;
            uVar153 = (uint)uVar142 + uVar180 * -2 + (uint)uVar184;
            uVar162 = iVar169 + iVar182 * -2 + iVar145;
            uVar163 = iVar171 + iVar183 * -2 + iVar150;
            uVar125 = uVar106 + uVar105 * -2 + uVar125;
            uVar105 = (int)uVar153 >> 0x1f;
            uVar164 = (int)uVar162 >> 0x1f;
            uVar170 = (int)uVar163 >> 0x1f;
            uVar173 = (int)uVar125 >> 0x1f;
            uVar106 = (int)uVar149 >> 0x1f;
            uVar165 = (int)uVar151 >> 0x1f;
            uVar172 = (int)uVar152 >> 0x1f;
            uVar179 = (int)uVar107 >> 0x1f;
            auVar176._0_4_ = -(uint)(auVar167._0_4_ < auVar147._0_4_);
            auVar176._4_4_ = -(uint)(auVar167._4_4_ < auVar147._4_4_);
            auVar176._8_4_ = -(uint)(auVar167._8_4_ < auVar147._8_4_);
            auVar176._12_4_ = -(uint)(auVar167._12_4_ < auVar147._12_4_);
            auVar175._0_4_ = -(uint)(auVar174._0_4_ < auVar156._0_4_);
            auVar175._4_4_ = -(uint)(auVar174._4_4_ < auVar156._4_4_);
            auVar175._8_4_ = -(uint)(auVar174._8_4_ < auVar156._8_4_);
            auVar175._12_4_ = -(uint)(auVar174._12_4_ < auVar156._12_4_);
            auVar175 = packssdw(auVar175,auVar176);
            auVar176 = packsswb(auVar175,auVar175);
            auVar181 = auVar174 ^ auVar104;
            auVar175 = auVar156 ^ auVar104;
            auVar157._0_4_ = -(uint)(auVar181._0_4_ < auVar175._0_4_);
            auVar157._4_4_ = -(uint)(auVar181._4_4_ < auVar175._4_4_);
            auVar157._8_4_ = -(uint)(auVar181._8_4_ < auVar175._8_4_);
            auVar157._12_4_ = -(uint)(auVar181._12_4_ < auVar175._12_4_);
            auVar175 = ~auVar157 & auVar156 | auVar174 & auVar157;
            auVar181._0_4_ = -(uint)((int)((uVar153 ^ uVar105) - uVar105) < auVar175._0_4_);
            auVar181._4_4_ = -(uint)((int)((uVar162 ^ uVar164) - uVar164) < auVar175._4_4_);
            auVar181._8_4_ = -(uint)((int)((uVar163 ^ uVar170) - uVar170) < auVar175._8_4_);
            auVar181._12_4_ = -(uint)((int)((uVar125 ^ uVar173) - uVar173) < auVar175._12_4_);
            auVar175 = auVar167 ^ auVar104;
            auVar157 = auVar147 ^ auVar104;
            auVar158._0_4_ = -(uint)(auVar175._0_4_ < auVar157._0_4_);
            auVar158._4_4_ = -(uint)(auVar175._4_4_ < auVar157._4_4_);
            auVar158._8_4_ = -(uint)(auVar175._8_4_ < auVar157._8_4_);
            auVar158._12_4_ = -(uint)(auVar175._12_4_ < auVar157._12_4_);
            auVar175 = ~auVar158 & auVar147 | auVar167 & auVar158;
            auVar159._0_4_ = -(uint)((int)((uVar149 ^ uVar106) - uVar106) < auVar175._0_4_);
            auVar159._4_4_ = -(uint)((int)((uVar151 ^ uVar165) - uVar165) < auVar175._4_4_);
            auVar159._8_4_ = -(uint)((int)((uVar152 ^ uVar172) - uVar172) < auVar175._8_4_);
            auVar159._12_4_ = -(uint)((int)((uVar107 ^ uVar179) - uVar179) < auVar175._12_4_);
            auVar175 = packssdw(auVar181,auVar159);
            auVar175 = packsswb(auVar175,auVar175);
            auVar137 = ~auVar175 & (~auVar176 & auVar136 | auVar135 & auVar176) |
                       auVar137 & auVar175;
            uVar2 = *(undefined8 *)(puVar129 + uVar109);
            auVar136._0_8_ =
                 CONCAT17(auVar137[7] + (char)((ulong)uVar2 >> 0x38),
                          CONCAT16(auVar137[6] + (char)((ulong)uVar2 >> 0x30),
                                   CONCAT15(auVar137[5] + (char)((ulong)uVar2 >> 0x28),
                                            CONCAT14(auVar137[4] + (char)((ulong)uVar2 >> 0x20),
                                                     CONCAT13(auVar137[3] +
                                                              (char)((ulong)uVar2 >> 0x18),
                                                              CONCAT12(auVar137[2] +
                                                                       (char)((ulong)uVar2 >> 0x10),
                                                                       CONCAT11(auVar137[1] +
                                                                                (char)((ulong)uVar2
                                                                                      >> 8),
                                                                                auVar137[0] +
                                                                                (char)uVar2)))))));
            auVar136[8] = auVar137[8];
            auVar136[9] = auVar137[9];
            auVar136[10] = auVar137[10];
            auVar136[0xb] = auVar137[0xb];
            auVar136[0xc] = auVar137[0xc];
            auVar136[0xd] = auVar137[0xd];
            auVar136[0xe] = auVar137[0xe];
            auVar136[0xf] = auVar137[0xf];
            *(undefined8 *)(puVar128 + uVar109) = auVar136._0_8_;
            uVar111 = uVar109 + 8;
            uVar114 = uVar109 + 0xf;
            uVar109 = uVar111;
            auVar137 = auVar135;
          } while (uVar114 < uVar1);
        }
        for (; uVar111 != uVar1; uVar111 = uVar111 + 1) {
          bVar118 = puVar120[uVar111];
          bVar112 = puVar120[uVar111 - uVar131];
          uVar105 = (uint)bVar118 - (uint)bVar112;
          uVar125 = -uVar105;
          if (0 < (int)uVar105) {
            uVar125 = uVar105;
          }
          bVar116 = *(byte *)(local_90 + uVar111);
          uVar125 = uVar125 & 0xff;
          uVar106 = (uint)bVar116 - (uint)bVar112;
          uVar105 = -uVar106;
          if (0 < (int)uVar106) {
            uVar105 = uVar106;
          }
          uVar107 = (uint)bVar118 + (uint)bVar116 + (uint)bVar112 * -2;
          uVar106 = -uVar107;
          if (0 < (int)uVar107) {
            uVar106 = uVar107;
          }
          if ((uVar105 & 0xff) < uVar125) {
            bVar116 = bVar118;
            uVar125 = uVar105 & 0xff;
          }
          if (uVar106 < uVar125) {
            bVar116 = bVar112;
          }
          puVar128[uVar111] = bVar116 + puVar129[uVar111];
        }
      }
      break;
    default:
      return 0x24;
    }
LAB_001229fc:
    puVar120 = out + uVar1 * uVar115;
    uVar115 = uVar115 + 1;
    puVar128 = puVar128 + uVar1;
    puVar129 = puVar129 + lVar122;
    local_90 = local_90 + uVar1;
    puVar123 = puVar123 + lVar122;
    puVar126 = puVar126 + lVar122;
    puVar110 = puVar110 + uVar1;
    puVar127 = puVar127 + lVar122;
    local_d0 = local_d0 + uVar1;
    local_c8 = local_c8 + lVar122;
    if (uVar115 == h) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}